

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrSetEnvironmentDepthHandRemovalMETA
                   (XrEnvironmentDepthProviderMETA environmentDepthProvider,
                   XrEnvironmentDepthHandRemovalSetInfoMETA *setInfo)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrEnvironmentDepthProviderMETA_T_*>::getWithInstanceInfo
                    (&g_environmentdepthprovidermeta_info,environmentDepthProvider);
  XVar1 = (*(pVar2.second)->dispatch_table->SetEnvironmentDepthHandRemovalMETA)
                    (environmentDepthProvider,setInfo);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrSetEnvironmentDepthHandRemovalMETA(
    XrEnvironmentDepthProviderMETA environmentDepthProvider,
    const XrEnvironmentDepthHandRemovalSetInfoMETA* setInfo) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_environmentdepthprovidermeta_info.getWithInstanceInfo(environmentDepthProvider);
        GenValidUsageXrHandleInfo *gen_environmentdepthprovidermeta_info = info_with_instance.first;
        (void)gen_environmentdepthprovidermeta_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->SetEnvironmentDepthHandRemovalMETA(environmentDepthProvider, setInfo);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}